

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall cs::statement_expression::~statement_expression(statement_expression *this)

{
  statement_expression *in_RDI;
  
  ~statement_expression(in_RDI);
  statement_base::operator_delete((void *)0x1e7ce2);
  return;
}

Assistant:

statement_expression() = delete;